

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int32 dict_read(FILE *fp,dict_t *d)

{
  s3cipid_t sVar1;
  int iVar2;
  s3wid_t sVar3;
  int iVar4;
  size_t sVar5;
  undefined8 in_stack_ffffffffffffff98;
  size_t phnalloc;
  size_t stralloc;
  int local_40;
  int32 maxwd;
  int32 i;
  s3wid_t w;
  int32 nwd;
  int32 lineno;
  s3cipid_t *p;
  char **wptr;
  lineiter_t *li;
  dict_t *d_local;
  FILE *fp_local;
  
  stralloc._4_4_ = 0x200;
  _nwd = (s3cipid_t *)
         __ckd_calloc__(0x204,2,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                        ,0x9d);
  p = (s3cipid_t *)
      __ckd_calloc__(0x200,8,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x9e);
  w = 0;
  iVar4 = 0;
  phnalloc = 0;
  wptr = &lineiter_start(fp)->buf;
  do {
    if (wptr == (char **)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0xd2,"Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
              (ulong)(uint)d->n_word,
              (long)((ulong)(uint)((int)phnalloc >> 0x1f) << 0x20 | phnalloc & 0xffffffff) / 0x400 &
              0xffffffff,CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),iVar4 / 0x400));
      ckd_free(_nwd);
      ckd_free(p);
      return 0;
    }
    w = w + 1;
    iVar2 = strncmp(*wptr,"##",2);
    if ((iVar2 != 0) && (iVar2 = strncmp(*wptr,";;",2), iVar2 != 0)) {
      i = str2words(*wptr,(char **)p,stralloc._4_4_);
      if (i < 0) {
        i = str2words(*wptr,(char **)0x0,0);
        if (i <= stralloc._4_4_) {
          __assert_fail("nwd > maxwd",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                        ,0xab,"int32 dict_read(FILE *, dict_t *)");
        }
        _nwd = (s3cipid_t *)
               __ckd_realloc__(_nwd,(long)(i + 4) << 1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                               ,0xad);
        p = (s3cipid_t *)
            __ckd_realloc__(p,(long)i << 3,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                            ,0xae);
        stralloc._4_4_ = i;
      }
      if (i != 0) {
        if (i == 1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0xb6,"Line %d: No pronunciation for word \'%s\'; ignored\n",(ulong)(uint)w,
                  *(undefined8 *)p);
        }
        else {
          for (local_40 = 1; local_40 < i; local_40 = local_40 + 1) {
            sVar1 = dict_ciphone_id(d,*(char **)(p + (long)local_40 * 4));
            _nwd[local_40 + -1] = sVar1;
            if (_nwd[local_40 + -1] < 0) {
              in_stack_ffffffffffffff98 = *(undefined8 *)p;
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                      ,0xc0,
                      "Line %d: Phone \'%s\' is missing in the acoustic model; word \'%s\' ignored\n"
                      ,(ulong)(uint)w,*(undefined8 *)(p + (long)local_40 * 4),
                      in_stack_ffffffffffffff98);
              break;
            }
          }
          if (local_40 == i) {
            sVar3 = dict_add_word(d,*(char **)p,_nwd,i + -1);
            if (sVar3 < 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                      ,0xca,"Line %d: Failed to add the word \'%s\' (duplicate?); ignored\n",
                      (ulong)(uint)w,*(undefined8 *)p);
            }
            else {
              sVar5 = strlen(d->word[sVar3].word);
              phnalloc = sVar5 + phnalloc;
              iVar4 = d->word[sVar3].pronlen * 2 + iVar4;
            }
          }
        }
      }
    }
    wptr = &lineiter_next((lineiter_t *)wptr)->buf;
  } while( true );
}

Assistant:

static int32
dict_read(FILE * fp, dict_t * d)
{
    lineiter_t *li;
    char **wptr;
    s3cipid_t *p;
    int32 lineno, nwd;
    s3wid_t w;
    int32 i, maxwd;
    size_t stralloc, phnalloc;

    maxwd = 512;
    p = (s3cipid_t *) ckd_calloc(maxwd + 4, sizeof(*p));
    wptr = (char **) ckd_calloc(maxwd, sizeof(char *)); /* Freed below */

    lineno = 0;
    stralloc = phnalloc = 0;
    for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
        lineno++;
        if (0 == strncmp(li->buf, "##", 2)
            || 0 == strncmp(li->buf, ";;", 2))
            continue;

        if ((nwd = str2words(li->buf, wptr, maxwd)) < 0) {
            /* Increase size of p, wptr. */
            nwd = str2words(li->buf, NULL, 0);
            assert(nwd > maxwd); /* why else would it fail? */
            maxwd = nwd;
            p = (s3cipid_t *) ckd_realloc(p, (maxwd + 4) * sizeof(*p));
            wptr = (char **) ckd_realloc(wptr, maxwd * sizeof(*wptr));
        }

        if (nwd == 0)           /* Empty line */
            continue;
        /* wptr[0] is the word-string and wptr[1..nwd-1] the pronunciation sequence */
        if (nwd == 1) {
            E_ERROR("Line %d: No pronunciation for word '%s'; ignored\n",
                    lineno, wptr[0]);
            continue;
        }


        /* Convert pronunciation string to CI-phone-ids */
        for (i = 1; i < nwd; i++) {
            p[i - 1] = dict_ciphone_id(d, wptr[i]);
            if (NOT_S3CIPID(p[i - 1])) {
                E_ERROR("Line %d: Phone '%s' is missing in the acoustic model; word '%s' ignored\n",
                        lineno, wptr[i], wptr[0]);
                break;
            }
        }

        if (i == nwd) {         /* All CI-phones successfully converted to IDs */
            w = dict_add_word(d, wptr[0], p, nwd - 1);
            if (NOT_S3WID(w))
                E_ERROR
                    ("Line %d: Failed to add the word '%s' (duplicate?); ignored\n",
                     lineno, wptr[0]);
            else {
                stralloc += strlen(d->word[w].word);
                phnalloc += d->word[w].pronlen * sizeof(s3cipid_t);
            }
        }
    }
    E_INFO("Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
           dict_size(d), (int)stralloc / 1024, (int)phnalloc / 1024);
    ckd_free(p);
    ckd_free(wptr);

    return 0;
}